

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O3

void blend_color_argb(int count,QT_FT_Span *spans,void *userData)

{
  quint32 *pqVar1;
  byte bVar2;
  char cVar3;
  QRgb QVar4;
  int iVar5;
  QThreadPool *pQVar6;
  undefined8 *puVar7;
  undefined8 *puVar8;
  ulong uVar9;
  long lVar10;
  uint uVar11;
  int iVar13;
  ulong uVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  long in_FS_OFFSET;
  QSemaphore semaphore;
  Operator op;
  undefined1 *local_110;
  Operator local_108;
  void *local_58;
  QT_FT_Span *local_50;
  CompositionFunctionSolid local_48;
  QRgb local_40;
  undefined4 uStack_3c;
  long local_38;
  ulong uVar12;
  
  uVar12 = (ulong)(uint)count;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  memcpy(&local_108,&DAT_006ce8d0,0xb0);
  getOperator(&local_108,(QSpanData *)userData,(QT_FT_Span *)0x0,0);
  QVar4 = QColor::rgba((QColor *)((long)userData + 0x98));
  if (local_108.mode == CompositionMode_Source) {
    if (count != 0) {
      do {
        pqVar1 = (quint32 *)
                 ((long)spans->y * *(long *)(*userData + 0x28) + *(long *)(*userData + 0x38) +
                 (long)spans->x * 4);
        bVar2 = spans->coverage;
        iVar15 = spans->len;
        if (bVar2 == 0xff) {
          (*qt_memfill32)(pqVar1,QVar4,(long)iVar15);
        }
        else if (iVar15 < 0x11) {
          if (0 < iVar15) {
            uVar9 = (ulong)(uint)bVar2 * (((ulong)QVar4 << 0x18 | (ulong)QVar4) & 0xff00ff00ff00ff);
            uVar9 = uVar9 + 0x80008000800080 + (uVar9 >> 8 & 0xff00ff00ff00ff) >> 8 &
                    0xff00ff00ff00ff;
            lVar10 = 0;
            do {
              uVar14 = (((ulong)pqVar1[lVar10] << 0x18 | (ulong)pqVar1[lVar10]) & 0xff00ff00ff00ff)
                       * (ulong)(byte)~bVar2;
              uVar14 = uVar14 + 0x80008000800080 + (uVar14 >> 8 & 0xff00ff00ff00ff) >> 8 &
                       0xff00ff00ff00ff;
              pqVar1[lVar10] =
                   ((uint)(uVar14 >> 0x18) | (uint)uVar14) + ((uint)(uVar9 >> 0x18) | (uint)uVar9);
              lVar10 = lVar10 + 1;
            } while (lVar10 < spans->len);
          }
        }
        else {
          (*local_108.funcSolid)(pqVar1,iVar15,QVar4,(uint)bVar2);
        }
        uVar11 = (int)uVar12 - 1;
        uVar12 = (ulong)uVar11;
        spans = spans + 1;
      } while (uVar11 != 0);
    }
  }
  else {
    local_48 = local_108.funcSolid;
    _local_40 = CONCAT44(0xaaaaaaaa,QVar4);
    iVar15 = count + 0x5f;
    if (-1 < count + 0x20) {
      iVar15 = count + 0x20;
    }
    local_58 = userData;
    local_50 = spans;
    pQVar6 = QGuiApplicationPrivate::qtGuiThreadPool();
    if (count < 0x60) {
      if (count < 1) goto LAB_00653bb4;
    }
    else if ((pQVar6 != (QThreadPool *)0x0) &&
            (2 < (int)qPixelLayouts[*(uint *)(*userData + 0x10)].bpp)) {
      QThread::currentThread();
      cVar3 = QThreadPool::contains((QThread *)pQVar6);
      if (cVar3 == '\0') {
        iVar15 = iVar15 >> 6;
        local_110 = &DAT_aaaaaaaaaaaaaaaa;
        iVar17 = 0;
        QSemaphore::QSemaphore((QSemaphore *)&local_110,0);
        iVar5 = 1;
        if (1 < iVar15) {
          iVar5 = iVar15;
        }
        iVar16 = 0;
        do {
          iVar13 = (count - iVar16) / (iVar15 + iVar17);
          puVar7 = (undefined8 *)operator_new(0x18);
          *(undefined1 *)(puVar7 + 1) = 1;
          *puVar7 = QFactoryLoader::keyMap;
          puVar8 = (undefined8 *)operator_new(0x20);
          *puVar8 = QRunnable::QGenericRunnable::
                    Helper<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/gui/painting/qdrawhelper.cpp:4058:5)>
                    ::impl;
          *(int *)(puVar8 + 1) = iVar16;
          *(int *)((long)puVar8 + 0xc) = iVar13;
          puVar8[2] = &local_58;
          puVar8[3] = &local_110;
          puVar7[2] = puVar8;
          QThreadPool::start((QRunnable *)pQVar6,(int)puVar7);
          iVar16 = iVar16 + iVar13;
          iVar17 = iVar17 + -1;
        } while (-iVar5 != iVar17);
        QSemaphore::acquire((int)(QSemaphore *)&local_110);
        QSemaphore::~QSemaphore((QSemaphore *)&local_110);
        goto LAB_00653bb4;
      }
    }
    lVar10 = 0;
    do {
      (*local_108.funcSolid)
                ((uint *)((long)*(int *)((long)&spans->y + lVar10) * *(long *)(*userData + 0x28) +
                          *(long *)(*userData + 0x38) + (long)*(int *)((long)&spans->x + lVar10) * 4
                         ),*(int *)((long)&spans->len + lVar10),QVar4,
                 (uint)(&spans->coverage)[lVar10]);
      lVar10 = lVar10 + 0x10;
    } while (uVar12 << 4 != lVar10);
  }
LAB_00653bb4:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void blend_color_argb(int count, const QT_FT_Span *spans, void *userData)
{
    QSpanData *data = reinterpret_cast<QSpanData *>(userData);

    const Operator op = getOperator(data, nullptr, 0);
    const uint color = data->solidColor.rgba();

    if (op.mode == QPainter::CompositionMode_Source) {
        // inline for performance
        while (count--) {
            uint *target = ((uint *)data->rasterBuffer->scanLine(spans->y)) + spans->x;
            if (spans->coverage == 255) {
                qt_memfill(target, color, spans->len);
#ifdef __SSE2__
            } else if (spans->len > 16) {
                op.funcSolid(target, spans->len, color, spans->coverage);
#endif
            } else {
                uint c = BYTE_MUL(color, spans->coverage);
                int ialpha = 255 - spans->coverage;
                for (int i = 0; i < spans->len; ++i)
                    target[i] = c + BYTE_MUL(target[i], ialpha);
            }
            ++spans;
        }
        return;
    }
    const auto funcSolid = op.funcSolid;
    auto function = [=] (int cStart, int cEnd) {
        for (int c = cStart; c < cEnd; ++c) {
            uint *target = ((uint *)data->rasterBuffer->scanLine(spans[c].y)) + spans[c].x;
            funcSolid(target, spans[c].len, color, spans[c].coverage);
        }
    };
    QT_THREAD_PARALLEL_FILLS(function);
}